

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  long lVar1;
  ostream *poVar2;
  int64_t eta;
  double lr;
  double wst;
  tuple<long,_double,_double> local_58;
  int64_t *local_40;
  double *local_38;
  double *local_30;
  
  progressInfo(&local_58,this,progress);
  local_40 = &eta;
  local_38 = &lr;
  local_30 = &wst;
  std::tuple<double&,double&,long&>::operator=((tuple<double&,double&,long&> *)&local_40,&local_58);
  *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) =
       *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(log_stream,"Progress: ");
  lVar1 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 8) = 1;
  *(undefined8 *)(log_stream + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  poVar2 = (ostream *)std::ostream::operator<<(log_stream,progress * 100.0);
  std::operator<<(poVar2,"%");
  poVar2 = std::operator<<(log_stream," words/sec/thread: ");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 7;
  std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(log_stream," lr: ");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 9;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 8) = 6;
  std::ostream::_M_insert<double>(lr);
  poVar2 = std::operator<<(log_stream," avg.loss: ");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 9;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 8) = 6;
  std::ostream::operator<<(poVar2,loss);
  poVar2 = std::operator<<(log_stream," ETA: ");
  utils::ClockPrint::ClockPrint((ClockPrint *)&local_58,(int32_t)eta);
  utils::operator<<(poVar2,(ClockPrint *)&local_58);
  std::ostream::flush();
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  double wst;
  double lr;
  int64_t eta;
  std::tie<double, double, int64_t>(wst, lr, eta) = progressInfo(progress);

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << (progress * 100) << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " avg.loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << utils::ClockPrint(eta);
  log_stream << std::flush;
}